

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# istream.cc
# Opt level: O0

void __thiscall wabt::interp::Istream::EmitInternal<unsigned_char>(Istream *this,uchar val)

{
  Offset offset;
  uchar val_local;
  Istream *this_local;
  
  offset = end(this);
  EmitAt<unsigned_char>(this,offset,val);
  return;
}

Assistant:

void WABT_VECTORCALL Istream::EmitInternal(T val) {
  EmitAt(end(), val);
}